

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O1

JavascriptPromiseAnyRejectElementFunction *
Js::VarTo<Js::JavascriptPromiseAnyRejectElementFunction,Js::RecyclableObject>(RecyclableObject *obj)

{
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar3 = VarIsImpl<Js::JavascriptFunction>(obj);
  if ((!bVar3) ||
     ((pp_Var1 = (obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject,
      pp_Var1 !=
      (_func_int **)VirtualTableInfo<Js::JavascriptPromiseAnyRejectElementFunction>::Address &&
      (pp_Var1 !=
       (_func_int **)
       VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptPromiseAnyRejectElementFunction>_>::
       Address)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/RecyclableObject.h"
                                ,0x208,"(VarIs<T>(obj))","VarIs<T>(obj)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return (JavascriptPromiseAnyRejectElementFunction *)obj;
}

Assistant:

T* VarTo(U* obj)
    {
        AssertOrFailFast(VarIs<T>(obj));
        return static_cast<T*>(obj);
    }